

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zmq.hpp
# Opt level: O0

int zmq::poll(pollfd *__fds,nfds_t __nfds,int __timeout)

{
  int iVar1;
  undefined8 uVar2;
  undefined4 in_register_00000014;
  int rc;
  undefined4 in_stack_ffffffffffffffe0;
  
  iVar1 = zmq_poll(__fds,__nfds & 0xffffffff,CONCAT44(in_register_00000014,__timeout));
  if (iVar1 < 0) {
    uVar2 = __cxa_allocate_exception(0x10);
    error_t::error_t((error_t *)CONCAT44(iVar1,in_stack_ffffffffffffffe0));
    __cxa_throw(uVar2,&error_t::typeinfo,error_t::~error_t);
  }
  return iVar1;
}

Assistant:

inline int poll(zmq_pollitem_t *items_, size_t nitems_, long timeout_ = -1)
{
    int rc = zmq_poll(items_, static_cast<int>(nitems_), timeout_);
    if (rc < 0)
        throw error_t();
    return rc;
}